

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makedefs.c
# Opt level: O0

void do_oracles(char *infile,char *outfile)

{
  FILE *pFVar1;
  boolean bVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  int local_140;
  uint local_13c;
  int i;
  int oracle_cnt;
  long fpos;
  long offset;
  long txt_offset;
  char local_118 [6];
  boolean ok;
  boolean in_oracle;
  char tempfile [256];
  char *outfile_local;
  char *infile_local;
  
  tempfile._248_8_ = outfile;
  sprintf(local_118,"%s.%s",outfile,"tmp");
  ifp = (FILE *)fopen(infile,"r");
  if ((FILE *)ifp == (FILE *)0x0) {
    perror(infile);
    exit(1);
  }
  ofp = (FILE *)fopen((char *)tempfile._248_8_,"w+");
  if ((FILE *)ofp == (FILE *)0x0) {
    perror((char *)tempfile._248_8_);
    fclose((FILE *)ifp);
    exit(1);
  }
  tfp = (FILE *)fopen(local_118,"w+");
  if ((FILE *)tfp == (FILE *)0x0) {
    perror(local_118);
    fclose((FILE *)ifp);
    fclose((FILE *)ofp);
    unlink((char *)tempfile._248_8_);
    exit(1);
  }
  fprintf((FILE *)ofp,"%s%5d\n",Dont_Edit_Data,0);
  fputs("---\n",(FILE *)tfp);
  pFVar1 = ofp;
  lVar4 = ftell((FILE *)tfp);
  fprintf((FILE *)pFVar1,"%05lx\n",lVar4);
  for (local_140 = 0; local_140 < 10; local_140 = local_140 + 1) {
    pcVar5 = xcrypt(special_oracle[local_140]);
    fputs(pcVar5,(FILE *)tfp);
    fputc(10,(FILE *)tfp);
  }
  local_13c = 1;
  fputs("---\n",(FILE *)tfp);
  pFVar1 = ofp;
  lVar4 = ftell((FILE *)tfp);
  fprintf((FILE *)pFVar1,"%05lx\n",lVar4);
  txt_offset._7_1_ = '\0';
  while (pcVar5 = fgets(in_line,0x100,(FILE *)ifp), pcVar5 != (char *)0x0) {
    bVar2 = h_filter(in_line);
    if (bVar2 == '\0') {
      iVar3 = strncmp(in_line,"-----",5);
      if (iVar3 == 0) {
        if (txt_offset._7_1_ != '\0') {
          txt_offset._7_1_ = '\0';
          local_13c = local_13c + 1;
          fputs("---\n",(FILE *)tfp);
          pFVar1 = ofp;
          lVar4 = ftell((FILE *)tfp);
          fprintf((FILE *)pFVar1,"%05lx\n",lVar4);
        }
      }
      else {
        txt_offset._7_1_ = '\x01';
        pcVar5 = xcrypt(in_line);
        fputs(pcVar5,(FILE *)tfp);
      }
    }
  }
  if (txt_offset._7_1_ != '\0') {
    local_13c = local_13c + 1;
    fputs("---\n",(FILE *)tfp);
    pFVar1 = ofp;
    lVar4 = ftell((FILE *)tfp);
    fprintf((FILE *)pFVar1,"%05lx\n",lVar4);
  }
  offset = ftell((FILE *)ofp);
  fclose((FILE *)ifp);
  sprintf(in_line,"rewind of \"%s\"",local_118);
  iVar3 = fseek((FILE *)tfp,0,0);
  if (iVar3 == 0) {
    while (pcVar5 = fgets(in_line,0x100,(FILE *)tfp), pcVar5 != (char *)0x0) {
      fputs(in_line,(FILE *)ofp);
    }
    fclose((FILE *)tfp);
    unlink(local_118);
    sprintf(in_line,"rewind of \"%s\"",tempfile._248_8_);
    iVar3 = fseek((FILE *)ofp,0,0);
    txt_offset._6_1_ = iVar3 == 0;
    if ((bool)txt_offset._6_1_) {
      sprintf(in_line,"header rewrite of \"%s\"",tempfile._248_8_);
      iVar3 = fprintf((FILE *)ofp,"%s%5d\n",Dont_Edit_Data,(ulong)local_13c);
      txt_offset._6_1_ = -1 < iVar3;
    }
    if ((bool)txt_offset._6_1_ != false) {
      sprintf(in_line,"data rewrite of \"%s\"",tempfile._248_8_);
      for (local_140 = 0; local_140 <= (int)local_13c; local_140 = local_140 + 1) {
        lVar4 = ftell((FILE *)ofp);
        txt_offset._6_1_ = -1 < lVar4;
        if (!(bool)txt_offset._6_1_) break;
        iVar3 = fseek((FILE *)ofp,lVar4,0);
        txt_offset._6_1_ = -1 < iVar3;
        if (!(bool)txt_offset._6_1_) break;
        iVar3 = __isoc99_fscanf(ofp,"%5lx",&fpos);
        txt_offset._6_1_ = iVar3 == 1;
        if (!(bool)txt_offset._6_1_) break;
        iVar3 = fseek((FILE *)ofp,lVar4,0);
        txt_offset._6_1_ = -1 < iVar3;
        if (!(bool)txt_offset._6_1_) break;
        iVar3 = fprintf((FILE *)ofp,"%05lx\n",fpos + offset);
        txt_offset._6_1_ = -1 < iVar3;
        if (!(bool)txt_offset._6_1_) break;
      }
    }
    if (txt_offset._6_1_ != '\0') {
      fclose((FILE *)ofp);
      return;
    }
  }
  perror(in_line);
  fclose((FILE *)ofp);
  unlink((char *)tempfile._248_8_);
  exit(1);
}

Assistant:

void do_oracles(const char *infile, const char *outfile)
{
	char	tempfile[256];
	boolean in_oracle, ok;
	long	txt_offset, offset, fpos;
	int	oracle_cnt;
	int i;

	sprintf(tempfile, "%s.%s", outfile, "tmp");

	if (!(ifp = fopen(infile, RDTMODE))) {
		perror(infile);
		exit(EXIT_FAILURE);
	}
	if (!(ofp = fopen(outfile, WRTMODE))) {
		perror(outfile);
		fclose(ifp);
		exit(EXIT_FAILURE);
	}
	if (!(tfp = fopen(tempfile, WRTMODE))) {	/* oracles.tmp */
		perror(tempfile);
		fclose(ifp);
		fclose(ofp);
		unlink(outfile);
		exit(EXIT_FAILURE);
	}

	/* output a dummy header record; we'll rewind and overwrite it later */
	fprintf(ofp, "%s%5d\n", Dont_Edit_Data, 0);

	/* handle special oracle; it must come first */
	fputs("---\n", tfp);
	fprintf(ofp, "%05lx\n", ftell(tfp));  /* start pos of special oracle */
	for (i = 0; i < SIZE(special_oracle); i++) {
	    fputs(xcrypt(special_oracle[i]), tfp);
	    fputc('\n', tfp);
	}

	oracle_cnt = 1;
	fputs("---\n", tfp);
	fprintf(ofp, "%05lx\n", ftell(tfp));	/* start pos of first oracle */
	in_oracle = FALSE;

	while (fgets(in_line, sizeof in_line, ifp)) {

	    if (h_filter(in_line)) continue;
	    if (!strncmp(in_line, "-----", 5)) {
		if (!in_oracle) continue;
		in_oracle = FALSE;
		oracle_cnt++;
		fputs("---\n", tfp);
		fprintf(ofp, "%05lx\n", ftell(tfp));
		/* start pos of this oracle */
	    } else {
		in_oracle = TRUE;
		fputs(xcrypt(in_line), tfp);
	    }
	}

	if (in_oracle) {	/* need to terminate last oracle */
	    oracle_cnt++;
	    fputs("---\n", tfp);
	    fprintf(ofp, "%05lx\n", ftell(tfp));	/* eof position */
	}

	/* record the current position */
	txt_offset = ftell(ofp);
	fclose(ifp);		/* all done with original input file */

	/* reprocess the scratch file; 1st format an error msg, just in case */
	sprintf(in_line, "rewind of \"%s\"", tempfile);
	if (rewind(tfp) != 0)  goto dead_data;
	/* copy all lines of text from the scratch file into the output file */
	while (fgets(in_line, sizeof in_line, tfp))
	    fputs(in_line, ofp);

	/* finished with scratch file */
	fclose(tfp);
	unlink(tempfile);	/* remove it */

	/* update the first record of the output file; prepare error msg 1st */
	sprintf(in_line, "rewind of \"%s\"", outfile);
	ok = (rewind(ofp) == 0);
	if (ok) {
	    sprintf(in_line, "header rewrite of \"%s\"", outfile);
	    ok = (fprintf(ofp, "%s%5d\n", Dont_Edit_Data, oracle_cnt) >=0);
	}
	if (ok) {
	    sprintf(in_line, "data rewrite of \"%s\"", outfile);
	    for (i = 0; i <= oracle_cnt; i++) {
		if (!(ok = (fpos = ftell(ofp)) >= 0)) break;
		if (!(ok = (fseek(ofp, fpos, SEEK_SET) >= 0))) break;
		if (!(ok = (fscanf(ofp, "%5lx", &offset) == 1))) break;
		if (!(ok = (fseek(ofp, fpos, SEEK_SET) >= 0))) break;
		if (!(ok = (fprintf(ofp, "%05lx\n", offset + txt_offset) >= 0)))
		    break;
	    }
	}
	if (!ok) {
dead_data:  perror(in_line);	/* report the problem */
	    /* close and kill the aborted output file, then give up */
	    fclose(ofp);
	    unlink(outfile);
	    exit(EXIT_FAILURE);
	}

	/* all done */
	fclose(ofp);

	return;
}